

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_readclosure(HSQUIRRELVM v,SQREADFUNC r,SQUserPointer up)

{
  bool bVar1;
  long lVar2;
  HSQUIRRELVM pSVar3;
  undefined8 in_RDX;
  code *in_RSI;
  SQObjectPtr *in_RDI;
  SQUserPointer unaff_retaddr;
  SQVM *in_stack_00000008;
  unsigned_short tag;
  SQObjectPtr closure;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  HSQUIRRELVM in_stack_ffffffffffffffa0;
  short local_32;
  SQObjectPtr local_30;
  undefined8 local_20;
  code *local_18;
  SQREADFUNC in_stack_fffffffffffffff8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  SQObjectPtr::SQObjectPtr(&local_30);
  lVar2 = (*local_18)(local_20,&local_32,2);
  if (lVar2 == 2) {
    if (local_32 == -0x506) {
      bVar1 = SQClosure::Load(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
      if (bVar1) {
        SQVM::Push(in_stack_ffffffffffffffa0,
                   (SQObjectPtr *)CONCAT17(bVar1,in_stack_ffffffffffffff98));
        pSVar3 = (HSQUIRRELVM)0x0;
      }
      else {
        pSVar3 = (HSQUIRRELVM)0xffffffffffffffff;
      }
    }
    else {
      in_stack_ffffffffffffffa0 =
           (HSQUIRRELVM)
           sq_throwerror(in_stack_ffffffffffffffa0,
                         (SQChar *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      pSVar3 = in_stack_ffffffffffffffa0;
    }
  }
  else {
    pSVar3 = (HSQUIRRELVM)
             sq_throwerror(in_stack_ffffffffffffffa0,
                           (SQChar *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
  return (SQRESULT)pSVar3;
}

Assistant:

SQRESULT sq_readclosure(HSQUIRRELVM v,SQREADFUNC r,SQUserPointer up)
{
    SQObjectPtr closure;

    unsigned short tag;
    if(r(up,&tag,2) != 2)
        return sq_throwerror(v,_SC("io error"));
    if(tag != SQ_BYTECODE_STREAM_TAG)
        return sq_throwerror(v,_SC("invalid stream"));
    if(!SQClosure::Load(v,up,r,closure))
        return SQ_ERROR;
    v->Push(closure);
    return SQ_OK;
}